

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O2

double __thiscall
imrt::ApertureILS::openBeamlet
          (ApertureILS *this,int beamlet,int aperture,Station *station,double c_eval,Plan *P)

{
  double dVar1;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  double local_60;
  _List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_58;
  _List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_40;
  
  local_58._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_58;
  local_58._M_impl._M_node._M_size = 0;
  local_58._M_impl._M_node.super__List_node_base._M_prev =
       local_58._M_impl._M_node.super__List_node_base._M_next;
  dVar1 = Station::getApertureIntensity(station,aperture);
  dVar1 = Plan::get_delta_eval(P,station,beamlet,dVar1,999999);
  local_60 = c_eval;
  if (dVar1 <= c_eval) {
    Station::openBeamlet_abi_cxx11_
              ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_40,
               station,beamlet,aperture);
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    _M_move_assign((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   &local_58,&local_40);
    std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
    _M_clear(&local_40);
    if (local_58._M_impl._M_node._M_size != 0) {
      local_60 = Plan::incremental_eval
                           (P,station,
                            (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             *)&local_58);
    }
  }
  else {
    Station::clearHistory(station);
  }
  std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
  _M_clear(&local_58);
  return local_60;
}

Assistant:

double ApertureILS::openBeamlet(int beamlet, int aperture, Station& station, double c_eval, Plan& P) {
  double aux_eval=0;
  list<pair<int, double> > diff;
  
  if (P.get_delta_eval(station, beamlet, station.getApertureIntensity(aperture)) > c_eval){
    station.clearHistory();
    return(c_eval);
  }

  diff = station.openBeamlet(beamlet, aperture);
  if(diff.size() <1) return(c_eval);
  c_eval = P.incremental_eval(station, diff);

  return(c_eval);
}